

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pca.cpp
# Opt level: O0

void __thiscall PCA::fit(PCA *this,Matrix *X)

{
  Index IVar1;
  non_const_type local_210;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>
  local_208;
  RowXpr local_1f8;
  __type local_1c0;
  RowXpr local_1b8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_180;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
  local_138;
  int local_c4;
  Index IStack_c0;
  int i;
  Index local_b8;
  undefined1 local_b0 [8];
  Matrix res;
  undefined1 local_90 [8];
  Vector iesima;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_70;
  VectorwiseOp<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> local_48;
  EigenBase<Eigen::PartialReduxExpr<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::internal::member_sum<double,_double>,_1>_>
  local_40 [16];
  undefined1 local_30 [8];
  Vector mu;
  int n;
  Matrix *X_local;
  PCA *this_local;
  
  IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::rows
                    (&X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>);
  mu.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ =
       (int)IVar1;
  local_48.m_matrix =
       (ExpressionTypeNested)
       Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::rowwise
                 ((DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)X);
  Eigen::VectorwiseOp<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::sum
            ((SumReturnType *)local_40,&local_48);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::PartialReduxExpr<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::internal::member_sum<double,double>,1>>
            ((Matrix<double,_1,1,0,_1,1> *)local_30,local_40);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator/
            (&local_70,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_30,
             (int *)((long)&mu.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows + 4));
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,_1,1,0,_1,1> *)local_30,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)&local_70);
  res.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols =
       Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::cols
                 (&X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_90,
             &res.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols)
  ;
  local_b8 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::rows
                       (&X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>);
  IStack_c0 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::cols
                        (&X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>);
  Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<long,long>
            ((Matrix<double,_1,_1,1,_1,_1> *)local_b0,&local_b8,&stack0xffffffffffffff40);
  for (local_c4 = 0;
      local_c4 <
      mu.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_;
      local_c4 = local_c4 + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::row
              (&local_1b8,(DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)X,(long)local_c4);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,1,-1,true>>::operator-
              (&local_180,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,_1,true>> *)&local_1b8
               ,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_30);
    local_1c0 = std::sqrt<int>(mu.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage.m_rows._4_4_ + -1);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,1,-1,true>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
    ::operator/(&local_138,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,_1,true>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                 *)&local_180,&local_1c0);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::row
              (&local_1f8,(DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)local_b0,
               (long)local_c4);
    Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,1,-1,true>::operator=
              ((Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,_1,true> *)&local_1f8,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>_>
                *)&local_138);
  }
  local_210 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)local_b0);
  local_208 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,1,-1,-1>>>::operator*
                        ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>> *)
                         &local_210,
                         (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)local_b0);
  Eigen::Matrix<double,-1,-1,1,-1,-1>::operator=
            ((Matrix<double,_1,_1,1,_1,_1> *)&this->covarianza,
             (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>_>
              *)&local_208);
  Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_1,__1,__1> *)local_b0);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_90);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_30);
  return;
}

Assistant:

void PCA::fit(Matrix X)
{
	int n = X.rows();

	Vector mu = X.rowwise().sum();
	mu = mu / n;

	Vector iesima(X.cols());

	Matrix res(X.rows(), X.cols());

	for(int i = 0; i < n; i++)
		res.row(i) = (X.row(i) - mu) / sqrt(n - 1);

	covarianza = (res.transpose())*res;
}